

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void do_vec_ld(DisasContext_conflict1 *s,int destidx,int element,TCGv_i64 tcg_addr,int size,
              MemOp endian)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_qemu_ld_i64_aarch64
            (s_00,(TCGv_i64)((long)ts - (long)s_00),tcg_addr,(ulong)(s->mmu_idx & 0xf),endian | size
            );
  write_vec_element(s,(TCGv_i64)((long)ts - (long)s_00),destidx,element,size);
  tcg_temp_free_internal_aarch64(s_00,ts);
  return;
}

Assistant:

static void do_vec_ld(DisasContext *s, int destidx, int element,
                      TCGv_i64 tcg_addr, int size, MemOp endian)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_tmp = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_qemu_ld_i64(tcg_ctx, tcg_tmp, tcg_addr, get_mem_index(s), endian | size);
    write_vec_element(s, tcg_tmp, destidx, element, size);

    tcg_temp_free_i64(tcg_ctx, tcg_tmp);
}